

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_convert_pcm_frames_format
               (void *pOut,ma_format formatOut,void *pIn,ma_format formatIn,ma_uint64 frameCount,
               ma_uint32 channels,ma_dither_mode ditherMode)

{
  ma_uint32 channels_local;
  ma_uint64 frameCount_local;
  ma_format formatIn_local;
  void *pIn_local;
  ma_format formatOut_local;
  void *pOut_local;
  
  ma_pcm_convert(pOut,formatOut,pIn,formatIn,frameCount * channels,ditherMode);
  return;
}

Assistant:

MA_API void ma_convert_pcm_frames_format(void* pOut, ma_format formatOut, const void* pIn, ma_format formatIn, ma_uint64 frameCount, ma_uint32 channels, ma_dither_mode ditherMode)
{
    ma_pcm_convert(pOut, formatOut, pIn, formatIn, frameCount * channels, ditherMode);
}